

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

HistoryEntry * __thiscall QTextBrowserPrivate::history(QTextBrowserPrivate *this,int i)

{
  qsizetype qVar1;
  HistoryEntry *this_00;
  int in_EDX;
  long in_RSI;
  HistoryEntry *in_RDI;
  HistoryEntry *in_stack_ffffffffffffffa8;
  HistoryEntry *in_stack_ffffffffffffffb0;
  
  if (in_EDX < 1) {
    qVar1 = QList<QTextBrowserPrivate::HistoryEntry>::size
                      ((QList<QTextBrowserPrivate::HistoryEntry> *)(in_RSI + 0x3c8));
    if (-in_EDX < qVar1) {
      QList<QTextBrowserPrivate::HistoryEntry>::size
                ((QList<QTextBrowserPrivate::HistoryEntry> *)(in_RSI + 0x3c8));
      QList<QTextBrowserPrivate::HistoryEntry>::operator[]
                ((QList<QTextBrowserPrivate::HistoryEntry> *)in_stack_ffffffffffffffb0,
                 (qsizetype)in_stack_ffffffffffffffa8);
      HistoryEntry::HistoryEntry(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    else {
      HistoryEntry::HistoryEntry(in_stack_ffffffffffffffb0);
    }
  }
  else {
    qVar1 = QList<QTextBrowserPrivate::HistoryEntry>::size
                      ((QList<QTextBrowserPrivate::HistoryEntry> *)(in_RSI + 0x3e0));
    if (qVar1 < in_EDX) {
      HistoryEntry::HistoryEntry(in_stack_ffffffffffffffb0);
    }
    else {
      this_00 = (HistoryEntry *)(in_RSI + 0x3e0);
      QList<QTextBrowserPrivate::HistoryEntry>::size
                ((QList<QTextBrowserPrivate::HistoryEntry> *)(in_RSI + 0x3e0));
      QList<QTextBrowserPrivate::HistoryEntry>::operator[]
                ((QList<QTextBrowserPrivate::HistoryEntry> *)this_00,
                 (qsizetype)in_stack_ffffffffffffffa8);
      HistoryEntry::HistoryEntry(this_00,in_stack_ffffffffffffffa8);
    }
  }
  return in_RDI;
}

Assistant:

HistoryEntry history(int i) const
    {
        if (i <= 0)
            if (-i < stack.size())
                return stack[stack.size()+i-1];
            else
                return HistoryEntry();
        else
            if (i <= forwardStack.size())
                return forwardStack[forwardStack.size()-i];
            else
                return HistoryEntry();
    }